

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugNames::NameIndex::dumpName
          (NameIndex *this,ScopedPrinter *W,NameTableEntry *NTE,Optional<unsigned_int> Hash)

{
  bool bVar1;
  uint32_t Val;
  uint *puVar2;
  raw_ostream *prVar3;
  char *Str;
  uint64_t local_f0;
  uint64_t EntryOffset;
  format_object<unsigned_long> local_e0;
  StringRef local_c8 [2];
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  string local_60;
  StringRef local_40;
  DelimitedScope<___,____> local_30;
  DictScope NameScope;
  NameTableEntry *NTE_local;
  ScopedPrinter *W_local;
  NameIndex *this_local;
  Optional<unsigned_int> Hash_local;
  
  NameScope.W = (ScopedPrinter *)NTE;
  this_local = (NameIndex *)Hash.Storage;
  Twine::Twine(&local_90,"Name ");
  Val = NameTableEntry::getIndex((NameTableEntry *)NameScope.W);
  Twine::Twine(&local_a8,Val);
  llvm::operator+(&local_78,&local_90,&local_a8);
  Twine::str_abi_cxx11_(&local_60,&local_78);
  StringRef::StringRef(&local_40,&local_60);
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_30,W,local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this_local);
  if (bVar1) {
    StringRef::StringRef(local_c8,"Hash");
    puVar2 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)&this_local);
    ScopedPrinter::printHex<unsigned_int>(W,local_c8[0],*puVar2);
  }
  prVar3 = ScopedPrinter::startLine(W);
  EntryOffset = NameTableEntry::getStringOffset((NameTableEntry *)NameScope.W);
  format<unsigned_long>(&local_e0,"String: 0x%08lx",&EntryOffset);
  raw_ostream::operator<<(prVar3,&local_e0.super_format_object_base);
  prVar3 = ScopedPrinter::getOStream(W);
  prVar3 = raw_ostream::operator<<(prVar3," \"");
  Str = NameTableEntry::getString((NameTableEntry *)NameScope.W);
  prVar3 = raw_ostream::operator<<(prVar3,Str);
  raw_ostream::operator<<(prVar3,"\"\n");
  local_f0 = NameTableEntry::getEntryOffset((NameTableEntry *)NameScope.W);
  do {
    bVar1 = dumpEntry(this,W,&local_f0);
  } while (bVar1);
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_30);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpName(ScopedPrinter &W,
                                          const NameTableEntry &NTE,
                                          Optional<uint32_t> Hash) const {
  DictScope NameScope(W, ("Name " + Twine(NTE.getIndex())).str());
  if (Hash)
    W.printHex("Hash", *Hash);

  W.startLine() << format("String: 0x%08" PRIx64, NTE.getStringOffset());
  W.getOStream() << " \"" << NTE.getString() << "\"\n";

  uint64_t EntryOffset = NTE.getEntryOffset();
  while (dumpEntry(W, &EntryOffset))
    /*empty*/;
}